

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeleLM.cpp
# Opt level: O0

void __thiscall
LM_Error_Value::tagCells1
          (LM_Error_Value *this,int *tag,int *tlo,int *thi,int *tagval,int *clearval,int *lo,int *hi
          ,int *domain_lo,int *domain_hi,Real *dx,Real *xlo,Real *prob_lo,Real *time,int *level)

{
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  Real *pRVar8;
  Real *pRVar9;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_stack_00000008;
  undefined8 in_stack_00000010;
  undefined8 in_stack_00000018;
  undefined8 in_stack_00000020;
  undefined8 in_stack_00000028;
  undefined8 in_stack_00000030;
  undefined8 in_stack_00000038;
  double *in_stack_00000040;
  int *in_stack_00000048;
  bool time_window_applies;
  bool one_side_hi;
  bool one_side_lo;
  bool in_valid_time_range;
  bool valid_time_range;
  bool max_level_applies;
  
  bVar2 = true;
  if (-1 < *(int *)(in_RDI + 0x70)) {
    bVar2 = *in_stack_00000048 < *(int *)(in_RDI + 0x70);
  }
  bVar3 = false;
  if ((0.0 <= *(double *)(in_RDI + 0x30)) && (bVar3 = false, 0.0 <= *(double *)(in_RDI + 0x38))) {
    bVar3 = *(double *)(in_RDI + 0x30) <= *(double *)(in_RDI + 0x38);
  }
  bVar4 = false;
  if ((bVar3) && (bVar4 = false, *(double *)(in_RDI + 0x30) <= *in_stack_00000040)) {
    bVar4 = *in_stack_00000040 <= *(double *)(in_RDI + 0x38);
  }
  bVar5 = false;
  if ((!bVar3) && (bVar5 = false, 0.0 <= *(double *)(in_RDI + 0x30))) {
    bVar5 = *(double *)(in_RDI + 0x30) <= *in_stack_00000040;
  }
  bVar6 = false;
  if ((!bVar3) && (bVar6 = false, 0.0 <= *(double *)(in_RDI + 0x38))) {
    bVar6 = *in_stack_00000040 <= *(double *)(in_RDI + 0x38);
  }
  bVar7 = true;
  if (((!bVar4) && (bVar7 = true, !bVar5)) && (bVar7 = true, !bVar6)) {
    bVar7 = (bool)(bVar3 ^ 1);
  }
  if ((bVar2) && (bVar7)) {
    pcVar1 = *(code **)(in_RDI + 0x20);
    pRVar8 = amrex::RealBox::lo((RealBox *)(in_RDI + 0x40));
    pRVar9 = amrex::RealBox::hi((RealBox *)(in_RDI + 0x40));
    (*pcVar1)(in_RSI,in_RDX,in_RCX,in_R8,in_R9,pRVar8,pRVar9,in_stack_00000008,in_stack_00000010,
              in_stack_00000018,in_stack_00000020,in_stack_00000028,in_stack_00000030,
              in_stack_00000038,in_stack_00000040,in_stack_00000048);
  }
  return;
}

Assistant:

void
LM_Error_Value::tagCells1(int* tag, const int* tlo, const int* thi,
                          const int* tagval, const int* clearval,
                          const int* lo, const int* hi,
                          const int* domain_lo, const int* domain_hi,
                          const Real* dx, const Real* xlo,
                          const Real* prob_lo, const Real* time,
                          const int* level) const
{
    AMREX_ASSERT(lmef_box);

    bool max_level_applies = ( (max_level < 0) || ( *level < max_level ) );
    bool valid_time_range = (min_time >= 0) && (max_time >= 0) && (min_time <= max_time);
    bool in_valid_time_range = valid_time_range && (*time >= min_time ) && (*time <= max_time);
    bool one_side_lo = !valid_time_range && (min_time >= 0) && (*time >= min_time);
    bool one_side_hi = !valid_time_range && (max_time >= 0) && (*time <= max_time);
    bool time_window_applies = in_valid_time_range || one_side_lo || one_side_hi || !valid_time_range;

    if (max_level_applies && time_window_applies)
    {
      lmef_box(tag, AMREX_ARLIM_ANYD(tlo), AMREX_ARLIM_ANYD(thi),
               tagval, clearval,
               AMREX_ZFILL(box.lo()), AMREX_ZFILL(box.hi()),
               lo, hi, domain_lo, domain_hi, dx, xlo, prob_lo, time, level);
    }
}